

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::ConeRecord2::Decode(ConeRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x57 < KVar1) {
    KDataStream::Read<unsigned_int>
              (stream,&(this->super_ConeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_ConeRecord1).super_EnvironmentRecord.m_ui16Length);
    KDataStream::Read(stream,&(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Index);
    KDataStream::Read(stream,&(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Padding);
    (*(this->super_ConeRecord1).m_Loc.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_ConeRecord1).m_Loc,stream);
    (*(this->super_ConeRecord1).m_Ori.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_ConeRecord1).m_Ori,stream);
    (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    KDataStream::Read<float>(stream,(float *)&(this->super_ConeRecord1).m_f32Height);
    KDataStream::Read<float>(stream,(float *)&this->m_f32ddtHeight);
    KDataStream::Read<float>(stream,(float *)&(this->super_ConeRecord1).m_f32PeakAngle);
    KDataStream::Read<float>(stream,(float *)&this->m_f32ddtPeak);
    KDataStream::Read<unsigned_int>(stream,&(this->super_ConeRecord1).m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ConeRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < CONE_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_AngularVelocity
           >> m_f32Height
           >> m_f32ddtHeight
           >> m_f32PeakAngle
           >> m_f32ddtPeak
           >> m_ui32Padding;
}